

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

void Abc_FrameGiaInputMiniLut(Abc_Frame_t *pAbc,void *p)

{
  Gia_Man_t *pNew;
  Gia_Man_t *pGia;
  void *p_local;
  Abc_Frame_t *pAbc_local;
  
  if (pAbc == (Abc_Frame_t *)0x0) {
    printf("ABC framework is not initialized by calling Abc_Start()\n");
  }
  pNew = Gia_ManFromMiniLut((Mini_Lut_t *)p,(Vec_Int_t **)0x0);
  Abc_FrameUpdateGia(pAbc,pNew);
  return;
}

Assistant:

void Abc_FrameGiaInputMiniLut( Abc_Frame_t * pAbc, void * p )
{
    Gia_Man_t * pGia;
    if ( pAbc == NULL )
        printf( "ABC framework is not initialized by calling Abc_Start()\n" );
    pGia = Gia_ManFromMiniLut( (Mini_Lut_t *)p, NULL );
    Abc_FrameUpdateGia( pAbc, pGia );
//    Gia_ManDelete( pGia );
}